

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCAEngine.h
# Opt level: O0

void __thiscall
Js::SCAEngine<void_*,_unsigned_int,_Js::SerializationCloner<Js::StreamWriter>_>::Clone
          (SCAEngine<void_*,_unsigned_int,_Js::SerializationCloner<Js::StreamWriter>_> *this,
          void *src,uint *dst)

{
  bool bVar1;
  ScriptContext *pSVar2;
  ThreadContext *this_00;
  SCADeepCloneType local_28;
  SrcTypeId local_24;
  SCADeepCloneType deepClone;
  SrcTypeId typeId;
  uint *dst_local;
  void *src_local;
  SCAEngine<void_*,_unsigned_int,_Js::SerializationCloner<Js::StreamWriter>_> *this_local;
  
  _deepClone = dst;
  dst_local = (uint *)src;
  src_local = this;
  pSVar2 = ScriptContextHolder::GetScriptContext((ScriptContextHolder *)this->m_cloner);
  this_00 = ScriptContext::GetThreadContext(pSVar2);
  pSVar2 = ScriptContextHolder::GetScriptContext((ScriptContextHolder *)this->m_cloner);
  ThreadContext::ProbeStack(this_00,0xc00,pSVar2,(PVOID)0x0);
  JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(dst_local);
  local_24 = SerializationCloner<Js::StreamWriter>::GetTypeId(this->m_cloner,dst_local);
  bVar1 = SerializationCloner<Js::StreamWriter>::TryClonePrimitive
                    (this->m_cloner,local_24,dst_local,_deepClone);
  if (!bVar1) {
    bVar1 = SerializationCloner<Js::StreamWriter>::ShouldLookupReference();
    if ((bVar1) && (bVar1 = TryGetClonedObject(this,dst_local,_deepClone), bVar1)) {
      SerializationCloner<Js::StreamWriter>::CloneObjectReference
                (this->m_cloner,dst_local,*_deepClone);
    }
    else {
      bVar1 = SerializationCloner<Js::StreamWriter>::TryCloneObject
                        (this->m_cloner,local_24,dst_local,_deepClone,&local_28);
      if (!bVar1) {
        ScriptContextHolder::ThrowSCAUnsupported((ScriptContextHolder *)this->m_cloner);
      }
      JsUtil::
      BaseDictionary<void_*,_unsigned_int,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::Add(this->m_clonedObjects,&dst_local,_deepClone);
      if (local_28 == Map) {
        SerializationCloner<Js::StreamWriter>::CloneMap(this->m_cloner,dst_local,*_deepClone);
        local_28 = Object;
      }
      else if (local_28 == Set) {
        SerializationCloner<Js::StreamWriter>::CloneSet(this->m_cloner,dst_local,*_deepClone);
        local_28 = Object;
      }
      if (local_28 == HostObject) {
        SerializationCloner<Js::StreamWriter>::CloneHostObjectProperties
                  (this->m_cloner,local_24,dst_local,*_deepClone);
      }
      else if (local_28 == Object) {
        SerializationCloner<Js::StreamWriter>::CloneProperties
                  (this->m_cloner,local_24,dst_local,*_deepClone);
      }
    }
  }
  return;
}

Assistant:

void Clone(Src src, Dst* dst)
        {
            PROBE_STACK(m_cloner->GetScriptContext(), Constants::MinStackDefault);

#if ENABLE_COPYONACCESS_ARRAY
            JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Src>(src);
#endif

            typename Cloner::SrcTypeId typeId = m_cloner->GetTypeId(src);

            if (m_cloner->TryClonePrimitive(typeId, src, dst))
            {
                return;
            }

            if (Cloner::ShouldLookupReference() && TryGetClonedObject(src, dst))
            {
                m_cloner->CloneObjectReference(src, *dst);
                return;
            }

            SCADeepCloneType deepClone;
            if (m_cloner->TryCloneObject(typeId, src, dst, &deepClone))
            {
                m_clonedObjects->Add(src, *dst);

                if (deepClone == SCADeepCloneType::Map)
                {
                    m_cloner->CloneMap(src, *dst);
                    deepClone = SCADeepCloneType::Object;
                }
                else if (deepClone == SCADeepCloneType::Set)
                {
                    m_cloner->CloneSet(src, *dst);
                    deepClone = SCADeepCloneType::Object;
                }

                if (deepClone == SCADeepCloneType::HostObject)
                {
                    m_cloner->CloneHostObjectProperties(typeId, src, *dst);
                }
                else if (deepClone == SCADeepCloneType::Object)
                {
                    m_cloner->CloneProperties(typeId, src, *dst);
                }
                return;
            }

            // Unsupported src type, throw
            m_cloner->ThrowSCAUnsupported();
        }